

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  pointer pSVar1;
  Int32 IVar2;
  _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  *this;
  pointer pSVar3;
  undefined4 *puVar4;
  size_t sVar5;
  undefined7 in_register_00000011;
  char *__p;
  pointer pSVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  anon_class_32_4_a6542874 AddShader;
  string msg_1;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  anon_class_32_4_a6542874 local_a8;
  string local_88;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    ActiveShaderStages = (SHADER_TYPE *)0x118;
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_a8.UniqueShaders =
       (unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
        *)local_68;
  local_a8.WaitUntilShadersReady = true;
  local_a8.ShaderStages = ShaderStages;
  local_a8.ActiveShaderStages = (SHADER_TYPE *)CONCAT71(in_register_00000011,WaitUntilShadersReady);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::_M_erase_at_end(ShaderStages,
                    (ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  pSVar6 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pSVar3 - (long)pSVar6;
  uVar7 = (lVar9 >> 4) * -0x3333333333333333;
  if (uVar7 < 6) {
    pSVar6 = (pointer)((lVar9 >> 4) * 0x3333333333333333 + 6);
    ActiveShaderStages =
         (SHADER_TYPE *)
         (((long)(ShaderStages->
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3 >> 4) *
         -0x3333333333333333);
    if (ActiveShaderStages < pSVar6) {
      pSVar3 = pSVar6;
      this = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
              *)std::
                vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                ::_M_check_len(ShaderStages,(size_type)pSVar6,"vector::_M_default_append");
      pSVar3 = std::
               _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ::_M_allocate(this,(size_t)pSVar3);
      lVar8 = uVar7 - 6;
      puVar4 = (undefined4 *)(lVar9 + (long)pSVar3);
      do {
        *puVar4 = 0;
        *(undefined8 *)(puVar4 + 2) = 0;
        *(undefined8 *)(puVar4 + 4) = 0;
        *(undefined8 *)(puVar4 + 6) = 0;
        *(undefined8 *)(puVar4 + 8) = 0;
        *(undefined8 *)(puVar4 + 10) = 0;
        *(undefined8 *)(puVar4 + 0xc) = 0;
        *(undefined8 *)(puVar4 + 0xe) = 0;
        *(undefined8 *)(puVar4 + 0x10) = 0;
        *(undefined8 *)(puVar4 + 0x12) = 0;
        puVar4 = puVar4 + 0x14;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      std::
      vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ::_S_relocate((ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_start,
                    (ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_finish,pSVar3,
                    (_Tp_alloc_type *)ActiveShaderStages);
      pSVar1 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pSVar1 != (pointer)0x0) {
        operator_delete(pSVar1,(long)(ShaderStages->
                                     super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pSVar1);
      }
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_start = pSVar3;
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((undefined4 *)(lVar9 + (long)pSVar3) + (long)pSVar6 * 0x14);
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3 + (long)this;
    }
    else {
      lVar9 = uVar7 - 6;
      do {
        (pSVar3->super_ShaderStageInfo).Type = SHADER_TYPE_UNKNOWN;
        (pSVar3->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar3->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar3->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pSVar3->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar3->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar3->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pSVar3->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar3->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar3->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar3 = pSVar3 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar3;
    }
  }
  else if (lVar9 != 0x1e0) {
    std::
    vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
    ::_M_erase_at_end(ShaderStages,pSVar6 + 6);
  }
  *(SHADER_TYPE *)CONCAT71(in_register_00000011,WaitUntilShadersReady) = SHADER_TYPE_UNKNOWN;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar9 = 8;
    uVar7 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar9));
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar7 < CreateInfo->GeneralShaderCount);
  }
  if (CreateInfo->TriangleHitShaderCount != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar9));
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar9));
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar7 < CreateInfo->TriangleHitShaderCount);
  }
  if (CreateInfo->ProceduralHitShaderCount != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)
                  ((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar9));
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar9))
      ;
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar9));
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar7 < CreateInfo->ProceduralHitShaderCount);
  }
  __p = (char *)0x3;
  IVar2 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  sVar5 = PipelineStateVkImpl::ShaderStageInfo::Count
                    (&(ShaderStages->
                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                      )._M_impl.super__Vector_impl_data._M_start[IVar2].super_ShaderStageInfo);
  if (sVar5 == 0) {
    __p = "ExtractShaders";
    ActiveShaderStages = (SHADER_TYPE *)0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  pSVar6 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (pSVar3 = (ShaderStages->
                  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                  )._M_impl.super__Vector_impl_data._M_finish, pSVar6 != pSVar3) {
    sVar5 = PipelineStateVkImpl::ShaderStageInfo::Count(&pSVar6->super_ShaderStageInfo);
    if (sVar5 == 0) {
      ActiveShaderStages = (SHADER_TYPE *)(pSVar6 + 1);
      pSVar3 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (((pointer)ActiveShaderStages != pSVar3) &&
         (uVar7 = (long)pSVar3 - (long)ActiveShaderStages, 0 < (long)uVar7)) {
        ActiveShaderStages = (SHADER_TYPE *)0xcccccccccccccccd;
        lVar9 = uVar7 / 0x50 + 1;
        pSVar3 = pSVar6;
        do {
          (pSVar3->super_ShaderStageInfo).Type = pSVar3[1].super_ShaderStageInfo.Type;
          std::
          vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
          _M_move_assign(&(pSVar3->super_ShaderStageInfo).Shaders,
                         &pSVar3[1].super_ShaderStageInfo.Shaders);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::_M_move_assign(&(pSVar3->super_ShaderStageInfo).SPIRVs,
                           &pSVar3[1].super_ShaderStageInfo.SPIRVs);
          __p = (char *)&pSVar3[1].Serialized;
          std::
          vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
          ::_M_move_assign(&pSVar3->Serialized);
          lVar9 = lVar9 + -1;
          pSVar3 = pSVar3 + 1;
        } while (1 < lVar9);
      }
      pSVar3 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar3;
      std::allocator_traits<std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>::
      destroy<Diligent::(anonymous_namespace)::ShaderStageInfoVk>
                ((allocator_type *)pSVar3,(ShaderStageInfoVk *)__p);
    }
    else {
      pSVar6 = pSVar6 + 1;
    }
  }
  if ((ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_start == pSVar3) {
    FormatString<char[26],char[22]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])ActiveShaderStages);
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}